

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs_queue.c
# Opt level: O2

job_t * create_job(void)

{
  job_t *pjVar1;
  http_request_old_t *phVar2;
  raw_client_data_t *prVar3;
  http_response_old_t *phVar4;
  
  pjVar1 = (job_t *)malloc(0x18);
  if (pjVar1 != (job_t *)0x0) {
    phVar2 = create_request();
    pjVar1->req = phVar2;
    if (phVar2 != (http_request_old_t *)0x0) {
      prVar3 = create_raw_data();
      pjVar1->raw_data = prVar3;
      if (prVar3 != (raw_client_data_t *)0x0) {
        phVar4 = create_http_response();
        pjVar1->response = phVar4;
        if (phVar4 != (http_response_old_t *)0x0) {
          return pjVar1;
        }
        return (job_t *)0x0;
      }
    }
  }
  return (job_t *)0x0;
}

Assistant:

job_t* create_job()
{
  job_t* j;

  if((j =(job_t*)malloc(sizeof(job_t))) == NULL)
    return NULL;
  if((j->req = create_request()) == NULL)
    return NULL;
  if((j->raw_data = create_raw_data()) == NULL)
    return NULL;
  if((j->response = create_http_response()) == NULL)
    return NULL;
  return j;

}